

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::ChineseCalendar::handleComputeMonthStart
          (ChineseCalendar *this,int32_t eyear,int32_t month,UBool useMonth)

{
  UErrorCode UVar1;
  int32_t iVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  UErrorCode UVar6;
  double dVar7;
  UErrorCode local_64;
  UErrorCode local_58;
  UErrorCode local_54;
  UErrorCode status;
  int32_t isLeapMonth;
  int32_t saveIsLeapMonth;
  int32_t saveMonth;
  int32_t julianDay;
  int32_t newMoon;
  int32_t theNewYear;
  int32_t gyear;
  double m;
  ChineseCalendar *nonConstThis;
  int32_t local_20;
  int32_t iStack_1c;
  UBool useMonth_local;
  int32_t month_local;
  int32_t eyear_local;
  ChineseCalendar *this_local;
  
  m = (double)this;
  nonConstThis._7_1_ = useMonth;
  local_20 = month;
  iStack_1c = eyear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    _theNewYear = (double)month;
    dVar7 = ClockMath::floorDivide(_theNewYear,12.0,(double *)&theNewYear);
    iStack_1c = (int)dVar7 + iStack_1c;
    local_20 = (int32_t)_theNewYear;
  }
  newMoon = (iStack_1c + *(int *)&(this->super_Calendar).field_0x264) - 1;
  julianDay = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])(this,(ulong)(uint)newMoon)
  ;
  saveMonth = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                        ((double)(julianDay + local_20 * 0x1d),this,1);
  saveIsLeapMonth = saveMonth + 0x253d8c;
  isLeapMonth = Calendar::internalGet(&this->super_Calendar,UCAL_MONTH);
  status = Calendar::internalGet(&this->super_Calendar,UCAL_IS_LEAP_MONTH);
  local_64 = status;
  if (nonConstThis._7_1_ == '\0') {
    local_64 = U_ZERO_ERROR;
  }
  local_54 = local_64;
  local_58 = U_ZERO_ERROR;
  Calendar::computeGregorianFields((Calendar *)m,saveIsLeapMonth,&local_58);
  UVar3 = ::U_FAILURE(local_58);
  dVar7 = m;
  iVar2 = saveMonth;
  if (UVar3 == '\0') {
    iVar4 = Calendar::getGregorianYear(&this->super_Calendar);
    iVar5 = Calendar::getGregorianMonth(&this->super_Calendar);
    (**(code **)(*(long *)dVar7 + 0x1c0))(dVar7,iVar2,iVar4,iVar5,0);
    iVar2 = local_20;
    iVar4 = Calendar::internalGet(&this->super_Calendar,UCAL_MONTH);
    UVar1 = local_54;
    if ((iVar2 != iVar4) ||
       (UVar6 = Calendar::internalGet(&this->super_Calendar,UCAL_IS_LEAP_MONTH), UVar1 != UVar6)) {
      saveMonth = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                            ((double)(saveMonth + 0x19),this,1);
      saveIsLeapMonth = saveMonth + 0x253d8c;
    }
    Calendar::internalSet((Calendar *)m,UCAL_MONTH,isLeapMonth);
    Calendar::internalSet((Calendar *)m,UCAL_IS_LEAP_MONTH,status);
    this_local._4_4_ = saveIsLeapMonth + -1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t ChineseCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool useMonth) const {

    ChineseCalendar *nonConstThis = (ChineseCalendar*)this; // cast away const

    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        double m = month;
        eyear += (int32_t)ClockMath::floorDivide(m, 12.0, m);
        month = (int32_t)m;
    }

    int32_t gyear = eyear + fEpochYear - 1; // Gregorian year
    int32_t theNewYear = newYear(gyear);
    int32_t newMoon = newMoonNear(theNewYear + month * 29, TRUE);
    
    int32_t julianDay = newMoon + kEpochStartAsJulianDay;

    // Save fields for later restoration
    int32_t saveMonth = internalGet(UCAL_MONTH);
    int32_t saveIsLeapMonth = internalGet(UCAL_IS_LEAP_MONTH);

    // Ignore IS_LEAP_MONTH field if useMonth is false
    int32_t isLeapMonth = useMonth ? saveIsLeapMonth : 0;

    UErrorCode status = U_ZERO_ERROR;
    nonConstThis->computeGregorianFields(julianDay, status);
    if (U_FAILURE(status))
        return 0;
    
    // This will modify the MONTH and IS_LEAP_MONTH fields (only)
    nonConstThis->computeChineseFields(newMoon, getGregorianYear(),
                         getGregorianMonth(), FALSE);        

    if (month != internalGet(UCAL_MONTH) ||
        isLeapMonth != internalGet(UCAL_IS_LEAP_MONTH)) {
        newMoon = newMoonNear(newMoon + SYNODIC_GAP, TRUE);
        julianDay = newMoon + kEpochStartAsJulianDay;
    }

    nonConstThis->internalSet(UCAL_MONTH, saveMonth);
    nonConstThis->internalSet(UCAL_IS_LEAP_MONTH, saveIsLeapMonth);

    return julianDay - 1;
}